

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pool_core.hpp
# Opt level: O0

bool __thiscall
boost::threadpool::detail::
pool_core<boost::function0<void>,_boost::threadpool::fifo_scheduler,_boost::threadpool::static_size,_boost::threadpool::resize_controller,_boost::threadpool::wait_for_all_tasks>
::execute_task(pool_core<boost::function0<void>,_boost::threadpool::fifo_scheduler,_boost::threadpool::static_size,_boost::threadpool::resize_controller,_boost::threadpool::wait_for_all_tasks>
               *this)

{
  bool bVar1;
  safe_bool sVar2;
  function0<void> *in_RDI;
  unique_lock<boost::recursive_mutex> *in_stack_00000010;
  condition_variable_any *in_stack_00000018;
  scoped_lock lock;
  pool_type *lockedThis;
  function0<void> task;
  recursive_mutex *in_stack_ffffffffffffff88;
  unique_lock<boost::recursive_mutex> *in_stack_ffffffffffffff90;
  condition_variable_any *in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffffa8;
  int iVar3;
  undefined4 in_stack_ffffffffffffffac;
  function0<void> *in_stack_ffffffffffffffb0;
  byte local_1;
  
  function0<void>::function0((function0<void> *)0x1921ad);
  unique_lock<boost::recursive_mutex>::unique_lock
            (in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
  if (*(ulong *)((long)&(in_RDI->super_function_base).functor + 0x10) <
      *(ulong *)((long)&(in_RDI->super_function_base).functor + 8)) {
    local_1 = 0;
    iVar3 = 1;
  }
  else {
    while (bVar1 = fifo_scheduler<boost::function0<void>_>::empty
                             ((fifo_scheduler<boost::function0<void>_> *)0x192216), bVar1) {
      if (*(ulong *)((long)&(in_RDI->super_function_base).functor + 0x10) <
          *(ulong *)((long)&(in_RDI->super_function_base).functor + 8)) {
        local_1 = 0;
        iVar3 = 1;
        goto LAB_001922ef;
      }
      in_RDI[1].super_function_base.vtable =
           (vtable_base *)((long)&in_RDI[1].super_function_base.vtable[-1].manager + 7);
      condition_variable_any::notify_all(in_stack_ffffffffffffff98);
      condition_variable_any::wait<boost::unique_lock<boost::recursive_mutex>>
                (in_stack_00000018,in_stack_00000010);
      in_RDI[1].super_function_base.vtable =
           (vtable_base *)((long)&(in_RDI[1].super_function_base.vtable)->manager + 1);
    }
    fifo_scheduler<boost::function0<void>_>::top
              ((fifo_scheduler<boost::function0<void>_> *)0x1922bf);
    function0<void>::operator=
              ((function0<void> *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),
               in_RDI);
    fifo_scheduler<boost::function0<void>_>::pop
              ((fifo_scheduler<boost::function0<void>_> *)0x1922e5);
    iVar3 = 0;
  }
LAB_001922ef:
  unique_lock<boost::recursive_mutex>::~unique_lock(in_stack_ffffffffffffff90);
  if (iVar3 == 0) {
    sVar2 = function0::operator_cast_to_function_pointer((function0<void> *)0x19230d);
    if (sVar2 != 0) {
      function0<void>::operator()(in_stack_ffffffffffffffb0);
    }
    local_1 = 1;
  }
  function0<void>::~function0((function0<void> *)0x192344);
  return (bool)(local_1 & 1);
}

Assistant:

bool execute_task() volatile
    {
      function0<void> task;

      { // fetch task
        pool_type* lockedThis = const_cast<pool_type*>(this);
        recursive_mutex::scoped_lock lock(lockedThis->m_monitor);

        // decrease number of threads if necessary
        if(m_worker_count > m_target_worker_count)
        {	
          return false;	// terminate worker
        }


        // wait for tasks
        while(lockedThis->m_scheduler.empty())
        {	
          // decrease number of workers if necessary
          if(m_worker_count > m_target_worker_count)
          {	
            return false;	// terminate worker
          }
          else
          {
            m_active_worker_count--;
            lockedThis->m_worker_idle_or_terminated_event.notify_all();	
            lockedThis->m_task_or_terminate_workers_event.wait(lock);
            m_active_worker_count++;
          }
        }

        task = lockedThis->m_scheduler.top();
        lockedThis->m_scheduler.pop();
      }

      // call task function
      if(task)
      {
        task();
      }
 
      //guard->disable();
      return true;
    }